

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::ShaderVkImpl::Initialize
          (ShaderVkImpl *this,ShaderCreateInfo *ShaderCI,CreateInfo *VkShaderCI)

{
  undefined *puVar1;
  _Head_base<0UL,_void_*,_false> Allocator_00;
  bool bVar2;
  bool bVar3;
  SHADER_COMPILE_FLAGS SVar4;
  int iVar5;
  Char *pCVar6;
  ulong uVar7;
  undefined8 uVar8;
  uint *__dest;
  undefined4 extraout_var;
  SPIRVShaderResources *pSVar9;
  element_type *peVar10;
  ShaderDesc *shaderDesc;
  char (*in_R8) [23];
  char *local_1c0;
  STDDeleter<Diligent::SPIRVShaderResources,_Diligent::IMemoryAllocator> local_158;
  undefined1 local_150 [8];
  string msg_3;
  bool LoadShaderInputs;
  undefined1 local_108 [8];
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> pRawMem;
  IMemoryAllocator *Allocator;
  string msg_2;
  string msg_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  undefined1 local_78 [8];
  string _msg;
  IDXCompiler *pDXCompiler;
  SHADER_COMPILER ShaderCompiler;
  undefined1 local_40 [8];
  string msg;
  CreateInfo *VkShaderCI_local;
  ShaderCreateInfo *ShaderCI_local;
  ShaderVkImpl *this_local;
  
  msg.field_2._8_8_ = VkShaderCI;
  if ((ShaderCI->Source == (Char *)0x0) && (ShaderCI->FilePath == (Char *)0x0)) {
    if (ShaderCI->ByteCode == (void *)0x0) {
      LogError<true,char[93]>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xd3,(char (*) [93])
                       "Shader source must be provided through one of the \'Source\', \'FilePath\' or \'ByteCode\' members"
                );
    }
    else {
      if ((ShaderCI->field_4).SourceLength == 0) {
        FormatString<char[27]>
                  ((string *)((long)&msg_2.field_2 + 8),(char (*) [27])"ByteCodeSize must not be 0")
        ;
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcc);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      if (((ShaderCI->field_4).SourceLength & 3) != 0) {
        FormatString<char[17],unsigned_long,char[23]>
                  ((string *)&Allocator,(Diligent *)"Byte code size (",
                   (char (*) [17])&ShaderCI->field_4,(unsigned_long *)") is not multiple of 4",in_R8
                  );
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xcd);
        std::__cxx11::string::~string((string *)&Allocator);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->m_SPIRV,(ShaderCI->field_4).SourceLength >> 2);
      __dest = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->m_SPIRV);
      memcpy(__dest,ShaderCI->ByteCode,(ShaderCI->field_4).SourceLength);
    }
  }
  else {
    if (ShaderCI->ByteCode != (void *)0x0) {
      FormatString<char[74]>
                ((string *)local_40,
                 (char (*) [74])
                 "\'ByteCode\' must be null when shader is created from source code or a file");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xa9);
      std::__cxx11::string::~string((string *)local_40);
    }
    pDXCompiler._0_4_ = ShaderCI->ShaderCompiler;
    if (((SHADER_COMPILER)pDXCompiler == SHADER_COMPILER_DXC) &&
       ((_msg.field_2._8_8_ = *msg.field_2._8_8_, (long *)_msg.field_2._8_8_ == (long *)0x0 ||
        (uVar7 = (**(code **)(*(long *)_msg.field_2._8_8_ + 0x18))(), (uVar7 & 1) == 0)))) {
      FormatString<char[57]>
                ((string *)local_78,
                 (char (*) [57])"DX Compiler is not loaded. Using default shader compiler");
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_78);
      pDXCompiler._0_4_ = SHADER_COMPILER_DEFAULT;
    }
    if ((SHADER_COMPILER)pDXCompiler < SHADER_COMPILER_DXC) {
      anon_unknown_115::CompileShaderGLSLang(&local_a8,ShaderCI,(CreateInfo *)msg.field_2._8_8_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_SPIRV,&local_a8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a8);
    }
    else if ((SHADER_COMPILER)pDXCompiler == SHADER_COMPILER_DXC) {
      anon_unknown_115::CompileShaderDXC(&local_90,ShaderCI,(CreateInfo *)msg.field_2._8_8_);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_SPIRV,&local_90);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_90);
    }
    else {
      LogError<true,char[28]>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,0xc2,(char (*) [28])"Unsupported shader compiler");
    }
    bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_SPIRV);
    if (bVar2) {
      msg_1.field_2._M_local_buf[0xf] = '\'';
      LogError<true,char[27],char_const*,char>
                (false,"Initialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                 ,199,(char (*) [27])"Failed to compile shader \'",
                 (char **)&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                           super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                           .m_Desc,msg_1.field_2._M_local_buf + 0xf);
    }
  }
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_SPIRV);
  if (!bVar2) {
    SVar4 = Diligent::operator&(ShaderCI->CompileFlags,SHADER_COMPILE_FLAG_SKIP_REFLECTION);
    if (SVar4 == SHADER_COMPILE_FLAG_NONE) {
      pRawMem._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl = GetRawAllocator();
      iVar5 = (**((IMemoryAllocator *)
                 pRawMem._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl)->_vptr_IMemoryAllocator)
                        (pRawMem._M_t.
                         super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                         .super__Head_base<0UL,_void_*,_false>._M_head_impl,0x58,
                         "Memory for SPIRVShaderResources",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                         ,0xe1);
      STDDeleter<void,_Diligent::IMemoryAllocator>::STDDeleter
                ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&stack0xfffffffffffffef0,
                 (IMemoryAllocator *)
                 pRawMem._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl);
      std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
      unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
                ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)local_108
                 ,(pointer)CONCAT44(extraout_var,iVar5),
                 (STDDeleter<void,_Diligent::IMemoryAllocator> *)&stack0xfffffffffffffef0);
      bVar2 = (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
              .m_Desc.ShaderType == SHADER_TYPE_VERTEX;
      pSVar9 = (SPIRVShaderResources *)
               std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::get
                         ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                           *)local_108);
      Allocator_00 = pRawMem._M_t.
                     super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                     .super__Head_base<0UL,_void_*,_false>;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&msg_3.field_2 + 8),
                 &this->m_SPIRV);
      shaderDesc = &(this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                    .m_Desc;
      if (((this->super_ShaderBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
           .m_Desc.UseCombinedTextureSamplers & 1U) == 0) {
        local_1c0 = (char *)0x0;
      }
      else {
        local_1c0 = (this->super_ShaderBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                    .m_Desc.CombinedSamplerSuffix;
      }
      SPIRVShaderResources::SPIRVShaderResources
                (pSVar9,(IMemoryAllocator *)Allocator_00._M_head_impl,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&msg_3.field_2 + 8),
                 shaderDesc,local_1c0,bVar2,(bool)(ShaderCI->LoadConstantBufferReflection & 1),
                 &this->m_EntryPoint);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)&msg_3.field_2 + 8));
      if (((ShaderCI->ByteCode == (void *)0x0) &&
          (bVar3 = std::operator==(&this->m_EntryPoint,ShaderCI->EntryPoint), !bVar3)) &&
         ((bVar3 = std::operator==(&this->m_EntryPoint,"main"), !bVar3 ||
          (SVar4 = Diligent::operator&(ShaderCI->CompileFlags,
                                       SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL),
          SVar4 == SHADER_COMPILE_FLAG_NONE)))) {
        FormatString<char[26],char[173]>
                  ((string *)local_150,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint || (m_EntryPoint == \"main\" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0)"
                   ,(char (*) [173])shaderDesc);
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"Initialize",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVkImpl.cpp"
                   ,0xf0);
        std::__cxx11::string::~string((string *)local_150);
      }
      pSVar9 = (SPIRVShaderResources *)
               std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::
               release((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                       local_108);
      STDDeleter<Diligent::SPIRVShaderResources,_Diligent::IMemoryAllocator>::STDDeleter
                (&local_158,
                 (IMemoryAllocator *)
                 pRawMem._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl);
      std::__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2>::
      reset<Diligent::SPIRVShaderResources,Diligent::STDDeleter<Diligent::SPIRVShaderResources,Diligent::IMemoryAllocator>>
                ((__shared_ptr<Diligent::SPIRVShaderResources_const,(__gnu_cxx::_Lock_policy)2> *)
                 &this->m_pShaderResources,pSVar9,&local_158);
      if (bVar2) {
        peVar10 = std::
                  __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_pShaderResources);
        bVar2 = SPIRVShaderResources::IsHLSLSource(peVar10);
        if (bVar2) {
          peVar10 = std::
                    __shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_pShaderResources);
          SPIRVShaderResources::MapHLSLVertexShaderInputs(peVar10,&this->m_SPIRV);
        }
      }
      std::unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>::~unique_ptr
                ((unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
                 local_108);
    }
    else {
      std::__cxx11::string::operator=((string *)&this->m_EntryPoint,ShaderCI->EntryPoint);
    }
    std::atomic<Diligent::SHADER_STATUS>::store
              (&(this->super_ShaderBase<Diligent::EngineVkImplTraits>).m_Status,SHADER_STATUS_READY,
               memory_order_seq_cst);
  }
  return;
}

Assistant:

void ShaderVkImpl::Initialize(const ShaderCreateInfo& ShaderCI,
                              const CreateInfo&       VkShaderCI)
{
    if (ShaderCI.Source != nullptr || ShaderCI.FilePath != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCode == nullptr, "'ByteCode' must be null when shader is created from source code or a file");

        SHADER_COMPILER ShaderCompiler = ShaderCI.ShaderCompiler;
        if (ShaderCompiler == SHADER_COMPILER_DXC)
        {
            IDXCompiler* pDXCompiler = VkShaderCI.pDXCompiler;
            if (pDXCompiler == nullptr || !pDXCompiler->IsLoaded())
            {
                LOG_WARNING_MESSAGE("DX Compiler is not loaded. Using default shader compiler");
                ShaderCompiler = SHADER_COMPILER_DEFAULT;
            }
        }

        switch (ShaderCompiler)
        {
            case SHADER_COMPILER_DXC:
                m_SPIRV = CompileShaderDXC(ShaderCI, VkShaderCI);
                break;

            case SHADER_COMPILER_DEFAULT:
            case SHADER_COMPILER_GLSLANG:
                m_SPIRV = CompileShaderGLSLang(ShaderCI, VkShaderCI);
                break;

            default:
                LOG_ERROR_AND_THROW("Unsupported shader compiler");
        }

        if (m_SPIRV.empty())
        {
            LOG_ERROR_AND_THROW("Failed to compile shader '", m_Desc.Name, '\'');
        }
    }
    else if (ShaderCI.ByteCode != nullptr)
    {
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize != 0, "ByteCodeSize must not be 0");
        DEV_CHECK_ERR(ShaderCI.ByteCodeSize % 4 == 0, "Byte code size (", ShaderCI.ByteCodeSize, ") is not multiple of 4");
        m_SPIRV.resize(ShaderCI.ByteCodeSize / 4);
        memcpy(m_SPIRV.data(), ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
    }
    else
    {
        LOG_ERROR_AND_THROW("Shader source must be provided through one of the 'Source', 'FilePath' or 'ByteCode' members");
    }

    // We cannot create shader module here because resource bindings are assigned when
    // pipeline state is created

    // Load shader resources
    if (!m_SPIRV.empty())
    {
        if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_SKIP_REFLECTION) == 0)
        {
            IMemoryAllocator& Allocator = GetRawAllocator();

            std::unique_ptr<void, STDDeleterRawMem<void>> pRawMem{
                ALLOCATE(Allocator, "Memory for SPIRVShaderResources", SPIRVShaderResources, 1),
                STDDeleterRawMem<void>(Allocator),
            };
            const bool LoadShaderInputs = m_Desc.ShaderType == SHADER_TYPE_VERTEX;
            new (pRawMem.get()) SPIRVShaderResources // May throw
                {
                    Allocator,
                    m_SPIRV,
                    m_Desc,
                    m_Desc.UseCombinedTextureSamplers ? m_Desc.CombinedSamplerSuffix : nullptr,
                    LoadShaderInputs,
                    ShaderCI.LoadConstantBufferReflection,
                    m_EntryPoint //
                };
            VERIFY_EXPR(ShaderCI.ByteCode != nullptr || m_EntryPoint == ShaderCI.EntryPoint ||
                        (m_EntryPoint == "main" && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) != 0));
            m_pShaderResources.reset(static_cast<SPIRVShaderResources*>(pRawMem.release()), STDDeleterRawMem<SPIRVShaderResources>(Allocator));

            if (LoadShaderInputs && m_pShaderResources->IsHLSLSource())
            {
                m_pShaderResources->MapHLSLVertexShaderInputs(m_SPIRV);
            }
        }
        else
        {
            m_EntryPoint = ShaderCI.EntryPoint;
        }

        m_Status.store(SHADER_STATUS_READY);
    }
}